

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeColsIntegrality
          (Highs *this,HighsInt num_set_entries,HighsInt *set,HighsVarType *integrality)

{
  HighsInt dimension;
  HighsStatus HVar1;
  HighsInt *in_RCX;
  Highs *in_RDX;
  int in_ESI;
  HighsStatus return_status;
  HighsStatus call_status;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  vector<int,_std::allocator<int>_> local_set;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  HighsStatus in_stack_fffffffffffffd90;
  HighsStatus in_stack_fffffffffffffd94;
  allocator *in_stack_fffffffffffffda0;
  HighsInt HVar2;
  HighsInt in_stack_fffffffffffffdb4;
  allocator_type *in_stack_fffffffffffffdb8;
  string *method;
  HighsVarType *in_stack_fffffffffffffdc0;
  HighsLogOptions *log_options;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  HighsStatus highs_return_status;
  HighsIndexCollection *index_collection_00;
  HighsVarType *in_stack_fffffffffffffe18;
  HighsVarType *in_stack_fffffffffffffe20;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  HighsInt in_stack_fffffffffffffe34;
  Highs *in_stack_fffffffffffffe38;
  undefined1 local_151 [133];
  HighsInt local_cc;
  HighsLogOptions local_c8;
  HighsInt *local_28;
  Highs *local_20;
  undefined4 local_14;
  HighsStatus local_4;
  
  if (in_ESI == 0) {
    local_4 = kOk;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    clearPresolve((Highs *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::allocator<HighsVarType>::allocator((allocator<HighsVarType> *)0x4927ef);
    std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (HighsVarType *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0,(allocator_type *)in_stack_fffffffffffffdb8);
    std::allocator<HighsVarType>::~allocator((allocator<HighsVarType> *)0x49281d);
    index_collection_00 =
         (HighsIndexCollection *)((long)&local_20->_vptr_Highs + (long)local_14 * 4);
    std::allocator<int>::allocator((allocator<int> *)0x49284d);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (int *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (int *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::allocator<int>::~allocator((allocator<int> *)0x492878);
    HVar2 = local_14;
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x49289d);
    sortSetData(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                in_stack_fffffffffffffe18);
    log_options = &local_c8;
    HighsIndexCollection::HighsIndexCollection
              ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
              );
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4928e2);
    dimension = create(index_collection_00,(HighsInt)((ulong)local_20 >> 0x20),local_28,HVar2);
    local_cc = dimension;
    if (dimension == 0) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x492af0);
      changeIntegralityInterface
                (in_stack_fffffffffffffe38,
                 (HighsIndexCollection *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (HighsVarType *)in_stack_fffffffffffffe28);
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      in_stack_fffffffffffffda0 = (allocator *)&stack0xfffffffffffffe1f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe20,"changeIntegrality",in_stack_fffffffffffffda0);
      HVar1 = interpretCallStatus((HighsLogOptions *)local_20,(HighsStatus)((ulong)local_28 >> 0x20)
                                  ,(HighsStatus)local_28,(string *)CONCAT44(HVar2,dimension));
      highs_return_status = (HighsStatus)((ulong)local_28 >> 0x20);
      in_stack_fffffffffffffd94 = HVar1;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x492bda);
      if (HVar1 == kError) {
        local_4 = kError;
      }
      else {
        in_stack_fffffffffffffd90 = returnFromHighs(local_20,highs_return_status);
        local_4 = in_stack_fffffffffffffd90;
      }
    }
    else {
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      method = (string *)local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_151 + 1),"changeColsIntegrality",(allocator *)method);
      HVar2 = local_cc;
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x49298e);
      local_4 = analyseSetCreateError
                          (log_options,method,in_stack_fffffffffffffdb4,(bool)local_14._3_1_,HVar2,
                           (HighsInt *)in_stack_fffffffffffffda0,dimension);
      std::__cxx11::string::~string((string *)(local_151 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_151);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4929ff);
    }
    HighsIndexCollection::~HighsIndexCollection
              ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
              );
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_fffffffffffffda0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsVarType* integrality) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearPresolve();
  // Ensure that the set and data are in ascending order
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, integrality,
              local_integrality.data());
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsIntegrality",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, local_integrality.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}